

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O1

void __thiscall bloom_tests::rolling_bloom::test_method(rolling_bloom *this)

{
  long lVar1;
  uchar *puVar2;
  void *pvVar3;
  bool bVar4;
  FastRandomContext *this_00;
  pointer *ppuVar5;
  long lVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  ulong uVar9;
  int iVar10;
  long in_FS_OFFSET;
  Span<std::byte> output;
  Span<const_unsigned_char> vKey;
  const_string file;
  Span<const_unsigned_char> vKey_00;
  Span<std::byte> output_00;
  Span<const_unsigned_char> vKey_01;
  const_string file_00;
  const_string file_01;
  Span<const_unsigned_char> vKey_02;
  const_string file_02;
  Span<const_unsigned_char> vKey_03;
  const_string file_03;
  Span<const_unsigned_char> vKey_04;
  Span<const_unsigned_char> vKey_05;
  const_string file_04;
  Span<const_unsigned_char> vKey_06;
  Span<std::byte> output_01;
  Span<const_unsigned_char> vKey_07;
  const_string file_05;
  Span<const_unsigned_char> vKey_08;
  Span<const_unsigned_char> vKey_09;
  const_string file_06;
  Span<const_unsigned_char> vKey_10;
  const_string file_07;
  Span<const_unsigned_char> vKey_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  check_type cVar12;
  char *pcVar11;
  char *local_2820;
  char *local_2818;
  undefined1 *local_2810;
  undefined1 *local_2808;
  char *local_2800;
  char *local_27f8;
  undefined1 *local_27f0;
  undefined1 *local_27e8;
  char *local_27e0;
  char *local_27d8;
  char *local_27d0;
  char *local_27c8;
  undefined1 *local_27c0;
  undefined1 *local_27b8;
  char *local_27b0;
  char *local_27a8;
  char *local_27a0;
  char *local_2798;
  undefined1 *local_2790;
  undefined1 *local_2788;
  char *local_2780;
  char *local_2778;
  char *local_2770;
  char *local_2768;
  undefined1 *local_2760;
  undefined1 *local_2758;
  char *local_2750;
  char *local_2748;
  char *local_2740;
  char *local_2738;
  undefined1 *local_2730;
  undefined1 *local_2728;
  char *local_2720;
  char *local_2718;
  char *local_2710;
  char *local_2708;
  undefined1 *local_2700;
  undefined1 *local_26f8;
  char *local_26f0;
  char *local_26e8;
  undefined4 local_26dc;
  assertion_result local_26d8;
  char *local_26c0;
  undefined1 *local_26b8;
  undefined1 *local_26b0;
  char *local_26a8;
  char *local_26a0;
  uint nHits;
  char *local_2690;
  char *local_2688;
  undefined1 *local_2680;
  undefined1 *local_2678;
  char *local_2670;
  char *local_2668;
  CRollingBloomFilter rb1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> d;
  uint *local_2608;
  char *local_2600;
  char *local_25f8;
  assertion_result local_25f0;
  CRollingBloomFilter rb2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data [399];
  
  data[0xe5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data[0x3a].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = 0;
  BasicTestingSetup::SeedRandomForTest((BasicTestingSetup *)this,ZEROS);
  CRollingBloomFilter::CRollingBloomFilter(&rb1,100,0.01);
  memset(data,0,0x2568);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_BasicTestingSetup.m_rng;
  do {
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    rb2.nEntriesPerGeneration = 0;
    rb2.nEntriesThisGeneration = 0;
    rb2.nGeneration = 0;
    rb2._12_4_ = 0;
    output.m_size = 0x20;
    output.m_data = (byte *)&rb2;
    FastRandomContext::fillrand(this_00,output);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&d,(uchar *)&rb2,
               (uchar *)&rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
               (allocator_type *)&local_26d8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar6),
               (vector<unsigned_char,std::allocator<unsigned_char>> *)&d);
    if (d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    puVar2 = *(uchar **)
              ((long)&data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar6);
    vKey.m_size = *(long *)((long)&data[0].
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + lVar6) -
                  (long)puVar2;
    vKey.m_data = puVar2;
    CRollingBloomFilter::insert(&rb1,vKey);
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x2568);
  lVar6 = 0x1c10;
  do {
    local_2670 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_2668 = "";
    local_2680 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2678 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x1e0;
    file.m_begin = (iterator)&local_2670;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2680,msg);
    puVar2 = *(uchar **)((long)data + lVar6 + -8);
    vKey_00.m_size =
         *(long *)((long)&data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar6) - (long)puVar2;
    vKey_00.m_data = puVar2;
    bVar4 = CRollingBloomFilter::contains(&rb1,vKey_00);
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_26d8._0_8_ = "rb1.contains(data[i])";
    local_26d8.m_message.px = (element_type *)0xe6a0ce;
    rb2._8_8_ = rb2._8_8_ & 0xffffffffffffff00;
    rb2._0_8_ = &PTR__lazy_ostream_013abc70;
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
    local_2690 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_2688 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_26d8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&d,(lazy_ostream *)&rb2,1,0,WARN,_cVar12,(size_t)&local_2690,
               0x1e0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x2570);
  nHits = 0;
  iVar10 = 10000;
  do {
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    rb2.nEntriesPerGeneration = 0;
    rb2.nEntriesThisGeneration = 0;
    rb2.nGeneration = 0;
    rb2._12_4_ = 0;
    output_00.m_size = 0x20;
    output_00.m_data = (byte *)&rb2;
    FastRandomContext::fillrand(this_00,output_00);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&d,(uchar *)&rb2,
               (uchar *)&rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
               (allocator_type *)&local_26d8);
    vKey_01.m_size =
         (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    vKey_01.m_data =
         d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    bVar4 = CRollingBloomFilter::contains(&rb1,vKey_01);
    if (d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (bVar4) {
      nHits = nHits + 1;
    }
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  local_26a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_26a0 = "";
  local_26b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_26b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1ed;
  file_00.m_begin = (iterator)&local_26a8;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_26b8,
             msg_00);
  local_26d8.m_message.px = (element_type *)((ulong)local_26d8.m_message.px & 0xffffffffffffff00);
  local_26d8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_26d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_26c0 = "";
  local_2608 = &nHits;
  local_25f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(nHits == 0x47);
  local_26dc = 0x47;
  local_25f0.m_message.px = (element_type *)0x0;
  local_25f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_25f8 = "";
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_2608;
  rb2._8_8_ = rb2._8_8_ & 0xffffffffffffff00;
  rb2._0_8_ = &PTR__lazy_ostream_013abbb0;
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "@;\x1f";
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pcVar11 = "nHits";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_25f0,(lazy_ostream *)&local_26d8,1,2,REQUIRE,0xe6a0cf,(size_t)&local_2600,0x1ed,
             &rb2,"71U",&d);
  boost::detail::shared_count::~shared_count(&local_25f0.m_message.pn);
  local_26f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_26e8 = "";
  local_2700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_26f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1ef;
  file_01.m_begin = (iterator)&local_26f0;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2700,
             msg_01);
  vKey_02.m_size =
       (long)data[0x18e].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)data[0x18e].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  vKey_02.m_data =
       data[0x18e].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  bVar4 = CRollingBloomFilter::contains(&rb1,vKey_02);
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_start._1_7_,bVar4);
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_26d8._0_8_ = "rb1.contains(data[DATASIZE-1])";
  local_26d8.m_message.px = (element_type *)0xe6a0f8;
  rb2._8_8_ = rb2._8_8_ & 0xffffffffffffff00;
  rb2._0_8_ = &PTR__lazy_ostream_013abc70;
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_26d8;
  local_2710 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2708 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&d,(lazy_ostream *)&rb2,1,0,WARN,(check_type)pcVar11,
             (size_t)&local_2710,0x1ef);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CRollingBloomFilter::reset(&rb1);
  local_2720 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2718 = "";
  local_2730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2728 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1f1;
  file_02.m_begin = (iterator)&local_2720;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2730,
             msg_02);
  vKey_03.m_size =
       (long)data[0x18e].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)data[0x18e].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  vKey_03.m_data =
       data[0x18e].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  bVar4 = CRollingBloomFilter::contains(&rb1,vKey_03);
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_start._1_7_,!bVar4);
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_26d8._0_8_ = "!rb1.contains(data[DATASIZE-1])";
  local_26d8.m_message.px = (element_type *)0xe6a0f8;
  rb2._8_8_ = rb2._8_8_ & 0xffffffffffffff00;
  rb2._0_8_ = &PTR__lazy_ostream_013abc70;
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_26d8;
  local_2740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2738 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&d,(lazy_ostream *)&rb2,1,0,WARN,(check_type)pcVar11,
             (size_t)&local_2740,0x1f1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ppuVar5 = &data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  uVar9 = 0;
  do {
    if (99 < uVar9) {
      local_2750 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_2748 = "";
      local_2760 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2758 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x1f7;
      file_03.m_begin = (iterator)&local_2750;
      msg_03.m_end = pvVar8;
      msg_03.m_begin = pvVar7;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2760,
                 msg_03);
      vKey_04.m_size = (long)ppuVar5[-300] - (long)ppuVar5[-0x12d];
      vKey_04.m_data = ppuVar5[-0x12d];
      bVar4 = CRollingBloomFilter::contains(&rb1,vKey_04);
      d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
      d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_26d8._0_8_ = "rb1.contains(data[i-100])";
      local_26d8.m_message.px = (element_type *)0xe6a112;
      rb2._8_8_ = rb2._8_8_ & 0xffffffffffffff00;
      rb2._0_8_ = &PTR__lazy_ostream_013abc70;
      rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
      rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_26d8;
      local_2770 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_2768 = "";
      pvVar7 = (iterator)0x1;
      pvVar8 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&d,(lazy_ostream *)&rb2,1,0,WARN,(check_type)pcVar11,
                 (size_t)&local_2770,0x1f7);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    vKey_05.m_size = (long)*ppuVar5 - (long)((_Vector_impl_data *)(ppuVar5 + -1))->_M_start;
    vKey_05.m_data = ((_Vector_impl_data *)(ppuVar5 + -1))->_M_start;
    CRollingBloomFilter::insert(&rb1,vKey_05);
    local_2780 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_2778 = "";
    local_2790 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2788 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x1f9;
    file_04.m_begin = (iterator)&local_2780;
    msg_04.m_end = pvVar8;
    msg_04.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2790,
               msg_04);
    vKey_06.m_size = (long)*ppuVar5 - (long)((_Vector_impl_data *)(ppuVar5 + -1))->_M_start;
    vKey_06.m_data = ((_Vector_impl_data *)(ppuVar5 + -1))->_M_start;
    bVar4 = CRollingBloomFilter::contains(&rb1,vKey_06);
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_26d8._0_8_ = "rb1.contains(data[i])";
    local_26d8.m_message.px = (element_type *)0xe6a0ce;
    rb2._8_8_ = rb2._8_8_ & 0xffffffffffffff00;
    rb2._0_8_ = &PTR__lazy_ostream_013abc70;
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_26d8;
    local_27a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_2798 = "";
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&d,(lazy_ostream *)&rb2,1,0,WARN,(check_type)pcVar11,
               (size_t)&local_27a0,0x1f9);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    uVar9 = uVar9 + 1;
    ppuVar5 = ppuVar5 + 3;
  } while (uVar9 != 399);
  iVar10 = 999;
  do {
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    rb2.nEntriesPerGeneration = 0;
    rb2.nEntriesThisGeneration = 0;
    rb2.nGeneration = 0;
    rb2._12_4_ = 0;
    output_01.m_size = 0x20;
    output_01.m_data = (byte *)&rb2;
    FastRandomContext::fillrand(this_00,output_01);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&d,(uchar *)&rb2,
               (uchar *)&rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
               (allocator_type *)&local_26d8);
    vKey_07.m_size =
         (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    vKey_07.m_data =
         d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    CRollingBloomFilter::insert(&rb1,vKey_07);
    local_27b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_27a8 = "";
    local_27c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_27b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x200;
    file_05.m_begin = (iterator)&local_27b0;
    msg_05.m_end = pvVar8;
    msg_05.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_27c0,
               msg_05);
    vKey_08.m_size =
         (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    vKey_08.m_data =
         d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    bVar4 = CRollingBloomFilter::contains(&rb1,vKey_08);
    local_26d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar4;
    local_26d8.m_message.px = (element_type *)0x0;
    local_26d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_25f0._0_8_ = "rb1.contains(d)";
    local_25f0.m_message.px = (element_type *)0xe6a122;
    rb2._8_8_ = rb2._8_8_ & 0xffffffffffffff00;
    rb2._0_8_ = &PTR__lazy_ostream_013abc70;
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
    rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_25f0;
    local_27d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_27c8 = "";
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_26d8,(lazy_ostream *)&rb2,1,0,WARN,(check_type)pcVar11,(size_t)&local_27d0,
               0x200);
    boost::detail::shared_count::~shared_count(&local_26d8.m_message.pn);
    if (d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  nHits = 0;
  lVar6 = 8;
  do {
    puVar2 = *(uchar **)((long)data + lVar6 + -8);
    vKey_09.m_size =
         *(long *)((long)&data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar6) - (long)puVar2;
    vKey_09.m_data = puVar2;
    bVar4 = CRollingBloomFilter::contains(&rb1,vKey_09);
    if (bVar4) {
      nHits = nHits + 1;
    }
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x2570);
  local_27e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_27d8 = "";
  local_27f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_27e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x209;
  file_06.m_begin = (iterator)&local_27e0;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_27f0,
             msg_06);
  local_26d8.m_message.px = (element_type *)((ulong)local_26d8.m_message.px & 0xffffffffffffff00);
  local_26d8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_26d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_26c0 = "";
  local_25f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(nHits == 3);
  local_26dc = 3;
  local_25f0.m_message.px = (element_type *)0x0;
  local_25f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_25f8 = "";
  local_2608 = &nHits;
  rb2._8_8_ = rb2._8_8_ & 0xffffffffffffff00;
  rb2._0_8_ = &PTR__lazy_ostream_013abbb0;
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)boost::unit_test::lazy_ostream::inst;
  rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_2608;
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "@;\x1f";
  d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pcVar11 = "nHits";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_25f0,(lazy_ostream *)&local_26d8,1,2,REQUIRE,0xe6a0cf,(size_t)&local_2600,0x209,
             &rb2,"3U",&d);
  boost::detail::shared_count::~shared_count(&local_25f0.m_message.pn);
  CRollingBloomFilter::CRollingBloomFilter(&rb2,1000,0.001);
  lVar6 = 8;
  do {
    puVar2 = *(uchar **)((long)data + lVar6 + -8);
    vKey_10.m_size =
         *(long *)((long)&data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar6) - (long)puVar2;
    vKey_10.m_data = puVar2;
    CRollingBloomFilter::insert(&rb2,vKey_10);
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x2570);
  lVar6 = 8;
  do {
    local_2800 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_27f8 = "";
    local_2810 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2808 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x212;
    file_07.m_begin = (iterator)&local_2800;
    msg_07.m_end = pvVar8;
    msg_07.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2810,
               msg_07);
    puVar2 = *(uchar **)((long)data + lVar6 + -8);
    vKey_11.m_size =
         *(long *)((long)&data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar6) - (long)puVar2;
    vKey_11.m_data = puVar2;
    bVar4 = CRollingBloomFilter::contains(&rb2,vKey_11);
    local_26d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar4;
    local_26d8.m_message.px = (element_type *)0x0;
    local_26d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_25f0._0_8_ = "rb2.contains(data[i])";
    local_25f0.m_message.px = (element_type *)0xe6a138;
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "@;\x1f";
    d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_2820 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_2818 = "";
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_26d8,(lazy_ostream *)&d,1,0,WARN,(check_type)pcVar11,(size_t)&local_2820,0x212
              );
    boost::detail::shared_count::~shared_count(&local_26d8.m_message.pn);
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x2570);
  if (rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)rb2.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  lVar6 = 0x2568;
  do {
    pvVar3 = *(void **)((long)&data[-1].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar6);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)((long)data + lVar6 + -8) - (long)pvVar3);
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != 0);
  if (rb1.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(rb1.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)rb1.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)rb1.data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rolling_bloom)
{
    SeedRandomForTest(SeedRand::ZEROS);

    // last-100-entry, 1% false positive:
    CRollingBloomFilter rb1(100, 0.01);

    // Overfill:
    static const int DATASIZE=399;
    std::vector<unsigned char> data[DATASIZE];
    for (int i = 0; i < DATASIZE; i++) {
        data[i] = RandomData();
        rb1.insert(data[i]);
    }
    // Last 100 guaranteed to be remembered:
    for (int i = 299; i < DATASIZE; i++) {
        BOOST_CHECK(rb1.contains(data[i]));
    }

    // false positive rate is 1%, so we should get about 100 hits if
    // testing 10,000 random keys. We get worst-case false positive
    // behavior when the filter is as full as possible, which is
    // when we've inserted one minus an integer multiple of nElement*2.
    unsigned int nHits = 0;
    for (int i = 0; i < 10000; i++) {
        if (rb1.contains(RandomData()))
            ++nHits;
    }
    // Expect about 100 hits
    BOOST_CHECK_EQUAL(nHits, 71U);

    BOOST_CHECK(rb1.contains(data[DATASIZE-1]));
    rb1.reset();
    BOOST_CHECK(!rb1.contains(data[DATASIZE-1]));

    // Now roll through data, make sure last 100 entries
    // are always remembered:
    for (int i = 0; i < DATASIZE; i++) {
        if (i >= 100)
            BOOST_CHECK(rb1.contains(data[i-100]));
        rb1.insert(data[i]);
        BOOST_CHECK(rb1.contains(data[i]));
    }

    // Insert 999 more random entries:
    for (int i = 0; i < 999; i++) {
        std::vector<unsigned char> d = RandomData();
        rb1.insert(d);
        BOOST_CHECK(rb1.contains(d));
    }
    // Sanity check to make sure the filter isn't just filling up:
    nHits = 0;
    for (int i = 0; i < DATASIZE; i++) {
        if (rb1.contains(data[i]))
            ++nHits;
    }
    // Expect about 5 false positives
    BOOST_CHECK_EQUAL(nHits, 3U);

    // last-1000-entry, 0.01% false positive:
    CRollingBloomFilter rb2(1000, 0.001);
    for (int i = 0; i < DATASIZE; i++) {
        rb2.insert(data[i]);
    }
    // ... room for all of them:
    for (int i = 0; i < DATASIZE; i++) {
        BOOST_CHECK(rb2.contains(data[i]));
    }
}